

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusAnalyzerSettings.cpp
# Opt level: O0

void __thiscall SMBusAnalyzerSettings::LoadSettings(SMBusAnalyzerSettings *this,char *settings)

{
  bool local_31;
  SMBusDecodeLevel local_30;
  bool calc_pec;
  int s;
  SimpleArchive local_20 [8];
  SimpleArchive text_archive;
  char *settings_local;
  SMBusAnalyzerSettings *this_local;
  
  _text_archive = settings;
  SimpleArchive::SimpleArchive(local_20);
  SimpleArchive::SetString((char *)local_20);
  SimpleArchive::operator>>(local_20,&this->mSMBDAT);
  SimpleArchive::operator>>(local_20,&this->mSMBCLK);
  SimpleArchive::operator>>(local_20,(int *)&local_30);
  this->mDecodeLevel = local_30;
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSMBDAT,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSMBCLK,true);
  SimpleArchive::operator>>(local_20,&local_31);
  AnalyzerSettingInterfaceBool::SetValue((bool)((char)this + -0x80));
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(local_20);
  return;
}

Assistant:

void SMBusAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    text_archive >> mSMBDAT;
    text_archive >> mSMBCLK;

    int s;
    text_archive >> s;
    mDecodeLevel = SMBusDecodeLevel( s );

    ClearChannels();

    AddChannel( mSMBDAT, "SMBDAT", true );
    AddChannel( mSMBCLK, "SMBCLK", true );

    bool calc_pec;
    text_archive >> calc_pec;
    mCalculatePECInterface.SetValue( calc_pec );

    UpdateInterfacesFromSettings();
}